

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall CLI::App::set_help_all_flag(App *this,string *name,string *description)

{
  pointer pcVar1;
  Option *pOVar2;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  string local_60;
  string local_40;
  
  if (this->help_all_ptr_ != (Option *)0x0) {
    remove_option(this,this->help_all_ptr_);
    this->help_all_ptr_ = (Option *)0x0;
  }
  if (name->_M_string_length == 0) {
    pOVar2 = (Option *)0x0;
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_70 = std::
               _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/benjaminkiesl[P]ut_tamarin/third-party/cli11/CLI11.hpp:2510:53)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/benjaminkiesl[P]ut_tamarin/third-party/cli11/CLI11.hpp:2510:53)>
               ::_M_manager;
    pcVar1 = (description->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + description->_M_string_length);
    pOVar2 = add_flag_function(this,&local_40,(function<void_(unsigned_long)> *)&local_88,&local_60)
    ;
    this->help_all_ptr_ = pOVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pOVar2 = this->help_all_ptr_;
    pOVar2->short_circuit_ = true;
    (pOVar2->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  return pOVar2;
}

Assistant:

Option *set_help_all_flag(std::string name = "", std::string description = "") {
        if(help_all_ptr_ != nullptr) {
            remove_option(help_all_ptr_);
            help_all_ptr_ = nullptr;
        }

        // Empty name will simply remove the help all flag
        if(!name.empty()) {
            help_all_ptr_ = add_flag_function(name, [](size_t) -> void { throw CallForAllHelp(); }, description);
            help_all_ptr_->short_circuit(true);
            help_all_ptr_->configurable(false);
        }

        return help_all_ptr_;
    }